

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomWidget::~DomWidget(DomWidget *this)

{
  QList<QString> *in_RDI;
  
  QList<QString>::clear(in_RDI);
  qDeleteAll<QList<DomProperty*>>((QList<DomProperty_*> *)in_RDI);
  QList<DomProperty_*>::clear((QList<DomProperty_*> *)in_RDI);
  qDeleteAll<QList<DomProperty*>>((QList<DomProperty_*> *)in_RDI);
  QList<DomProperty_*>::clear((QList<DomProperty_*> *)in_RDI);
  qDeleteAll<QList<DomRow*>>((QList<DomRow_*> *)in_RDI);
  QList<DomRow_*>::clear((QList<DomRow_*> *)in_RDI);
  qDeleteAll<QList<DomColumn*>>((QList<DomColumn_*> *)in_RDI);
  QList<DomColumn_*>::clear((QList<DomColumn_*> *)in_RDI);
  qDeleteAll<QList<DomItem*>>((QList<DomItem_*> *)in_RDI);
  QList<DomItem_*>::clear((QList<DomItem_*> *)in_RDI);
  qDeleteAll<QList<DomLayout*>>((QList<DomLayout_*> *)in_RDI);
  QList<DomLayout_*>::clear((QList<DomLayout_*> *)in_RDI);
  qDeleteAll<QList<DomWidget*>>((QList<DomWidget_*> *)in_RDI);
  QList<DomWidget_*>::clear((QList<DomWidget_*> *)in_RDI);
  qDeleteAll<QList<DomAction*>>((QList<DomAction_*> *)in_RDI);
  QList<DomAction_*>::clear((QList<DomAction_*> *)in_RDI);
  qDeleteAll<QList<DomActionGroup*>>((QList<DomActionGroup_*> *)in_RDI);
  QList<DomActionGroup_*>::clear((QList<DomActionGroup_*> *)in_RDI);
  qDeleteAll<QList<DomActionRef*>>((QList<DomActionRef_*> *)in_RDI);
  QList<DomActionRef_*>::clear((QList<DomActionRef_*> *)in_RDI);
  QList<QString>::clear(in_RDI);
  QList<QString>::~QList((QList<QString> *)0x1b1eaa);
  QList<DomActionRef_*>::~QList((QList<DomActionRef_*> *)0x1b1ebb);
  QList<DomActionGroup_*>::~QList((QList<DomActionGroup_*> *)0x1b1ecc);
  QList<DomAction_*>::~QList((QList<DomAction_*> *)0x1b1edd);
  QList<DomWidget_*>::~QList((QList<DomWidget_*> *)0x1b1eee);
  QList<DomLayout_*>::~QList((QList<DomLayout_*> *)0x1b1eff);
  QList<DomItem_*>::~QList((QList<DomItem_*> *)0x1b1f10);
  QList<DomColumn_*>::~QList((QList<DomColumn_*> *)0x1b1f21);
  QList<DomRow_*>::~QList((QList<DomRow_*> *)0x1b1f32);
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x1b1f40);
  QList<DomProperty_*>::~QList((QList<DomProperty_*> *)0x1b1f4e);
  QList<QString>::~QList((QList<QString> *)0x1b1f5c);
  QString::~QString((QString *)0x1b1f6a);
  QString::~QString((QString *)0x1b1f74);
  return;
}

Assistant:

DomWidget::~DomWidget()
{
    m_class.clear();
    qDeleteAll(m_property);
    m_property.clear();
    qDeleteAll(m_attribute);
    m_attribute.clear();
    qDeleteAll(m_row);
    m_row.clear();
    qDeleteAll(m_column);
    m_column.clear();
    qDeleteAll(m_item);
    m_item.clear();
    qDeleteAll(m_layout);
    m_layout.clear();
    qDeleteAll(m_widget);
    m_widget.clear();
    qDeleteAll(m_action);
    m_action.clear();
    qDeleteAll(m_actionGroup);
    m_actionGroup.clear();
    qDeleteAll(m_addAction);
    m_addAction.clear();
    m_zOrder.clear();
}